

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

_Bool previous_mode_performed_poorly
                (PREDICTION_MODE mode,MV_REFERENCE_FRAME ref_frame,uint (*vars) [8],
                int64_t (*uv_dist) [8])

{
  int64_t local_40;
  uint local_38;
  _Bool var_bad;
  float mult;
  int midx;
  int64_t best_uv_dist;
  uint best_var;
  int64_t (*uv_dist_local) [8];
  uint (*vars_local) [8];
  MV_REFERENCE_FRAME ref_frame_local;
  PREDICTION_MODE mode_local;
  
  best_var = 0xffffffff;
  best_uv_dist = 0x7fffffffffffffff;
  for (midx = 0; midx < 4; midx = midx + 1) {
    if (best_var < vars[midx][ref_frame]) {
      local_38 = best_var;
    }
    else {
      local_38 = vars[midx][ref_frame];
    }
    best_var = local_38;
    if (best_uv_dist < uv_dist[midx][ref_frame]) {
      local_40 = best_uv_dist;
    }
    else {
      local_40 = uv_dist[midx][ref_frame];
    }
    best_uv_dist = local_40;
  }
  var_bad = (float)best_var * 1.125 < (float)vars[(ulong)mode - 0xd][ref_frame];
  if ((uv_dist[(int)(mode - 0xd)][ref_frame] < 0x7fffffffffffffff) &&
     (best_uv_dist != uv_dist[(int)(mode - 0xd)][ref_frame])) {
    var_bad = var_bad && (float)best_uv_dist * 1.125 < (float)uv_dist[(int)(mode - 0xd)][ref_frame];
  }
  return var_bad;
}

Assistant:

static inline bool previous_mode_performed_poorly(
    PREDICTION_MODE mode, MV_REFERENCE_FRAME ref_frame,
    const unsigned int (*vars)[REF_FRAMES],
    const int64_t (*uv_dist)[REF_FRAMES]) {
  unsigned int best_var = UINT_MAX;
  int64_t best_uv_dist = INT64_MAX;
  for (int midx = 0; midx < RTC_INTER_MODES; midx++) {
    best_var = AOMMIN(best_var, vars[midx][ref_frame]);
    best_uv_dist = AOMMIN(best_uv_dist, uv_dist[midx][ref_frame]);
  }
  assert(best_var != UINT_MAX && "Invalid variance data.");
  const float mult = 1.125f;
  bool var_bad = mult * best_var < vars[INTER_OFFSET(mode)][ref_frame];
  if (uv_dist[INTER_OFFSET(mode)][ref_frame] < INT64_MAX &&
      best_uv_dist != uv_dist[INTER_OFFSET(mode)][ref_frame]) {
    // If we have chroma info, then take it into account
    var_bad &= mult * best_uv_dist < uv_dist[INTER_OFFSET(mode)][ref_frame];
  }
  return var_bad;
}